

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall ON_RevSurface::Read(ON_RevSurface *this,ON_BinaryArchive *file)

{
  ON_Interval *t;
  bool bVar1;
  int iVar2;
  ON_Curve *pOVar3;
  double *pdVar4;
  char bHaveCurve;
  int bTransposedAsInt;
  double local_40;
  ON_Object *obj;
  int minor_version;
  int major_version;
  
  major_version = 0;
  minor_version = 0;
  bHaveCurve = '\0';
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
  if (major_version == 1 && bVar1) {
    ON_BinaryArchive::ReadLine(file,&this->m_axis);
    t = &this->m_angle;
    ON_BinaryArchive::ReadInterval(file,t);
    ON_BinaryArchive::ReadBoundingBox(file,&this->m_bbox);
    bTransposedAsInt = (int)this->m_bTransposed;
    bVar1 = ON_BinaryArchive::ReadInt(file,&bTransposedAsInt);
    if (bVar1) {
      this->m_bTransposed = bTransposedAsInt != 0;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&bHaveCurve);
    if (bHaveCurve != '\0') {
      obj = (ON_Object *)0x0;
      iVar2 = ON_BinaryArchive::ReadObject(file,&obj);
      bVar1 = iVar2 != 0;
      if (obj != (ON_Object *)0x0) {
        pOVar3 = ON_Curve::Cast(obj);
        this->m_curve = pOVar3;
        if ((pOVar3 == (ON_Curve *)0x0) && (obj != (ON_Object *)0x0)) {
          (*obj->_vptr_ON_Object[4])();
        }
      }
    }
    local_40 = ON_Interval::Min(t);
    pdVar4 = ON_Interval::operator[](&this->m_t,0);
    *pdVar4 = local_40;
    local_40 = ON_Interval::Max(t);
    pdVar4 = ON_Interval::operator[](&this->m_t,1);
    *pdVar4 = local_40;
  }
  else if (major_version == 2 && bVar1) {
    ON_BinaryArchive::ReadLine(file,&this->m_axis);
    ON_BinaryArchive::ReadInterval(file,&this->m_angle);
    ON_BinaryArchive::ReadInterval(file,&this->m_t);
    ON_BinaryArchive::ReadBoundingBox(file,&this->m_bbox);
    bTransposedAsInt = (int)this->m_bTransposed;
    bVar1 = ON_BinaryArchive::ReadInt(file,&bTransposedAsInt);
    if (bVar1) {
      this->m_bTransposed = bTransposedAsInt != 0;
    }
    bVar1 = ON_BinaryArchive::ReadChar(file,&bHaveCurve);
    if (bHaveCurve != '\0') {
      obj = (ON_Object *)0x0;
      iVar2 = ON_BinaryArchive::ReadObject(file,&obj);
      bVar1 = iVar2 != 0;
      if (obj != (ON_Object *)0x0) {
        pOVar3 = ON_Curve::Cast(obj);
        this->m_curve = pOVar3;
        if ((pOVar3 == (ON_Curve *)0x0) && (obj != (ON_Object *)0x0)) {
          (*obj->_vptr_ON_Object[4])();
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool ON_RevSurface::Read( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  char bHaveCurve = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version == 1) 
  {
    rc = file.ReadLine( m_axis );
    rc = file.ReadInterval( m_angle );
    rc = file.ReadBoundingBox( m_bbox );
    int bTransposedAsInt = m_bTransposed ? 1 : 0;
    rc = file.ReadInt( &bTransposedAsInt );
    if (rc)
      m_bTransposed = bTransposedAsInt ? true : false;
    rc = file.ReadChar( &bHaveCurve );
    if ( bHaveCurve ) 
    {
      ON_Object* obj = 0;
      rc = file.ReadObject(&obj);
      if ( obj ) 
      {
        m_curve = ON_Curve::Cast(obj);
        if ( !m_curve )
          delete obj;
      }
    }
    m_t[0] = m_angle.Min();
    m_t[1] = m_angle.Max();
  }
  else if (rc && major_version == 2) 
  {
    rc = file.ReadLine( m_axis );
    rc = file.ReadInterval( m_angle );
    rc = file.ReadInterval( m_t );
    rc = file.ReadBoundingBox( m_bbox );
    int bTransposedAsInt = m_bTransposed ? 1 : 0;
    rc = file.ReadInt( &bTransposedAsInt );
    if (rc) 
      m_bTransposed = bTransposedAsInt ? true : false;
    rc = file.ReadChar( &bHaveCurve );
    if ( bHaveCurve ) 
    {
      ON_Object* obj = 0;
      rc = file.ReadObject(&obj);
      if ( obj ) 
      {
        m_curve = ON_Curve::Cast(obj);
        if ( !m_curve )
          delete obj;
      }
    }
  }
  return rc;
}